

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

wchar_t slot_by_name(player *p,char *name)

{
  int iVar1;
  char **ppcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(p->body).count;
  if (uVar4 != 0) {
    ppcVar2 = &((p->body).slots)->name;
    uVar3 = 0;
    do {
      iVar1 = strcmp(name,*ppcVar2);
      if (iVar1 == 0) {
        return (wchar_t)uVar3;
      }
      uVar3 = uVar3 + 1;
      ppcVar2 = ppcVar2 + 4;
    } while (uVar4 != uVar3);
  }
  __assert_fail("i < p->body.count",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                ,0x3f,"int slot_by_name(struct player *, const char *)");
}

Assistant:

int slot_by_name(struct player *p, const char *name)
{
	int i;

	/* Look for the correctly named slot */
	for (i = 0; i < p->body.count; i++) {
		if (streq(name, p->body.slots[i].name)) {
			break;
		}
	}

	assert(i < p->body.count);

	/* Index for that slot */
	return i;
}